

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int report_inlined_functions
              (uintptr_t pc,function *function,backtrace_full_callback callback,void *data,
              char **filename,int *lineno)

{
  function_addrs *pfVar1;
  function *function_00;
  uintptr_t *puVar2;
  int iVar3;
  void *pvVar4;
  function_addrs *pfVar5;
  function_addrs *pfVar6;
  ulong local_38;
  uintptr_t pc_local;
  
  iVar3 = 0;
  if ((pc != 0xffffffffffffffff && function->function_addrs_count != 0) &&
     (local_38 = pc,
     pvVar4 = bsearch(&local_38,function->function_addrs,function->function_addrs_count,0x18,
                      function_addrs_search), pvVar4 != (void *)0x0)) {
    pfVar5 = (function_addrs *)((long)pvVar4 + -0x18);
    do {
      pfVar6 = pfVar5 + 1;
      pfVar1 = pfVar5 + 2;
      pfVar5 = pfVar6;
    } while (local_38 == pfVar1->low);
    while (pfVar6->high <= local_38) {
      if (pfVar6 == function->function_addrs) {
        return 0;
      }
      pfVar5 = pfVar6 + -1;
      puVar2 = &pfVar6->low;
      pfVar6 = pfVar6 + -1;
      if (pfVar5->low < *puVar2) {
        return 0;
      }
    }
    function_00 = pfVar6->function;
    iVar3 = report_inlined_functions(local_38,function_00,callback,data,filename,lineno);
    if ((iVar3 == 0) &&
       (iVar3 = (*callback)(data,local_38,*filename,*lineno,function_00->name), iVar3 == 0)) {
      *filename = function_00->caller_filename;
      *lineno = function_00->caller_lineno;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
report_inlined_functions (uintptr_t pc, struct function *function,
			  backtrace_full_callback callback, void *data,
			  const char **filename, int *lineno)
{
  struct function_addrs *p;
  struct function_addrs *match;
  struct function *inlined;
  int ret;

  if (function->function_addrs_count == 0)
    return 0;

  /* Our search isn't safe if pc == -1, as that is the sentinel
     value.  */
  if (pc + 1 == 0)
    return 0;

  p = ((struct function_addrs *)
       bsearch (&pc, function->function_addrs,
		function->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return 0;

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  match = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  match = p;
	  break;
	}
      if (p == function->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (match == NULL)
    return 0;

  /* We found an inlined call.  */

  inlined = match->function;

  /* Report any calls inlined into this one.  */
  ret = report_inlined_functions (pc, inlined, callback, data,
				  filename, lineno);
  if (ret != 0)
    return ret;

  /* Report this inlined call.  */
  ret = callback (data, pc, *filename, *lineno, inlined->name);
  if (ret != 0)
    return ret;

  /* Our caller will report the caller of the inlined function; tell
     it the appropriate filename and line number.  */
  *filename = inlined->caller_filename;
  *lineno = inlined->caller_lineno;

  return 0;
}